

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O1

void Fxu_HeapSingleMoveDn(Fxu_HeapSingle *p,Fxu_Single *pSingle)

{
  Fxu_Single **ppFVar1;
  int iVar2;
  int iVar3;
  Fxu_Single *pFVar4;
  uint uVar5;
  int iVar6;
  Fxu_Single **ppFVar7;
  Fxu_Single **ppFVar8;
  Fxu_Single *pFVar9;
  
  iVar2 = p->nItems;
  pFVar4 = p->pTree[pSingle->HNum];
  uVar5 = pFVar4->HNum * 2;
  if ((int)uVar5 <= iVar2) {
    ppFVar7 = p->pTree + pSingle->HNum;
    iVar6 = pFVar4->HNum;
    do {
      ppFVar8 = p->pTree + (int)uVar5;
      if ((int)uVar5 < iVar2) {
        ppFVar1 = p->pTree + (int)(uVar5 | 1);
        iVar3 = (*ppFVar8)->Weight;
        if ((iVar3 <= pFVar4->Weight) && ((*ppFVar1)->Weight <= pFVar4->Weight)) {
          return;
        }
        pFVar9 = *ppFVar8;
        if (iVar3 < (*ppFVar1)->Weight) {
          ppFVar8 = ppFVar1;
          pFVar9 = *ppFVar1;
        }
      }
      else {
        pFVar9 = *ppFVar8;
        if ((*ppFVar8)->Weight <= pFVar4->Weight) {
          return;
        }
      }
      *ppFVar7 = pFVar9;
      *ppFVar8 = pFVar4;
      iVar3 = (*ppFVar7)->HNum;
      (*ppFVar7)->HNum = iVar6;
      pFVar4->HNum = iVar3;
      uVar5 = iVar3 * 2;
      ppFVar7 = ppFVar8;
      iVar6 = iVar3;
    } while ((int)uVar5 <= iVar2);
  }
  return;
}

Assistant:

void Fxu_HeapSingleMoveDn( Fxu_HeapSingle * p, Fxu_Single * pSingle )
{
    Fxu_Single ** ppChild1, ** ppChild2, ** ppSingle;
    ppSingle = &FXU_HEAP_SINGLE_CURRENT(p, pSingle);
    while ( FXU_HEAP_SINGLE_CHILD1_EXISTS(p,*ppSingle) )
    { // if Child1 does not exist, Child2 also does not exists

        // get the children
        ppChild1 = &FXU_HEAP_SINGLE_CHILD1(p,*ppSingle);
        if ( FXU_HEAP_SINGLE_CHILD2_EXISTS(p,*ppSingle) )
        {
            ppChild2 = &FXU_HEAP_SINGLE_CHILD2(p,*ppSingle);

            // consider two cases
            if ( FXU_HEAP_SINGLE_WEIGHT(*ppSingle) >= FXU_HEAP_SINGLE_WEIGHT(*ppChild1) &&
                 FXU_HEAP_SINGLE_WEIGHT(*ppSingle) >= FXU_HEAP_SINGLE_WEIGHT(*ppChild2) )
            { // Var is larger than both, skip
                break;
            }
            else
            { // Var is smaller than one of them, then swap it with larger 
                if ( FXU_HEAP_SINGLE_WEIGHT(*ppChild1) >= FXU_HEAP_SINGLE_WEIGHT(*ppChild2) )
                {
                    Fxu_HeapSingleSwap( ppSingle, ppChild1 );
                    // update the pointer
                    ppSingle = ppChild1;
                }
                else
                {
                    Fxu_HeapSingleSwap( ppSingle, ppChild2 );
                    // update the pointer
                    ppSingle = ppChild2;
                }
            }
        }
        else // Child2 does not exist
        {
            // consider two cases
            if ( FXU_HEAP_SINGLE_WEIGHT(*ppSingle) >= FXU_HEAP_SINGLE_WEIGHT(*ppChild1) )
            { // Var is larger than Child1, skip
                break;
            }
            else
            { // Var is smaller than Child1, then swap them
                Fxu_HeapSingleSwap( ppSingle, ppChild1 );
                // update the pointer
                ppSingle = ppChild1;
            }
        }
    }
}